

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_statistics(int cur_k)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  long lVar4;
  int in_EDI;
  long total_not_unified_edges;
  pair<const_long,_Node> *node;
  iterator __end2;
  iterator __begin2;
  unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
  *__range2;
  long total_letters;
  long total_not_unified_nodes;
  long total_edges;
  unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
  *in_stack_ffffffffffffffa8;
  Logger *pLVar5;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_38;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> local_30;
  unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
  *local_28;
  long local_20;
  size_type local_18;
  long local_10;
  int local_4;
  
  if (statistics != 0) {
    pLVar5 = logger;
    local_4 = in_EDI;
    sVar2 = std::
            unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
            ::size((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                    *)0x103291);
    Logger::info(pLVar5,"total_nodes: %ld",sVar2);
    if (statistics == 2) {
      local_10 = count_edges();
      local_18 = std::
                 unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                 ::size((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                         *)0x1032ca);
      local_20 = 0;
      local_28 = &Node::nodes;
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
           ::begin(in_stack_ffffffffffffffa8);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
           ::end(in_stack_ffffffffffffffa8);
      while (bVar1 = std::__detail::operator!=(&local_30,&local_38), bVar1) {
        ppVar3 = std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::operator*
                           ((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)0x103325);
        if ((ppVar3->second).sequence_len < local_4) {
          Logger::fatal(logger,"ERROR in cur_k during statistics!");
          break;
        }
        local_18 = (long)((ppVar3->second).sequence_len - local_4) + local_18;
        local_20 = (ppVar3->second).sequence_len + local_20;
        std::__detail::_Node_iterator<std::pair<const_long,_Node>,_false,_false>::operator++
                  ((_Node_iterator<std::pair<const_long,_Node>,_false,_false> *)pLVar5);
      }
      lVar4 = local_10 + local_18;
      sVar2 = std::
              unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
              ::size((unordered_map<long,_Node,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_Node>_>_>
                      *)0x1033a7);
      Logger::debugl2(logger,"total_edges: %ld",local_10);
      Logger::debug(logger,"total_nodes (expanded): %ld",local_18);
      Logger::debugl2(logger,"total_edges (expanded): %ld",lVar4 - sVar2);
      pLVar5 = logger;
      lVar4 = count_deadends();
      Logger::debugl2(pLVar5,"total_deadends: %ld",lVar4);
      Logger::debug(logger,"total_letters: %ld",local_20);
    }
  }
  return;
}

Assistant:

void print_statistics(int cur_k) {
    if (statistics == 0)
        return;
    logger->info("total_nodes: %ld", Node::nodes.size());
    if (statistics == 2) {
        long total_edges = count_edges();
        long total_not_unified_nodes = Node::nodes.size();
        long total_letters = 0;
        for (auto &node: Node::nodes) {
            if (node.second.sequence_len < cur_k) {
                logger->fatal("ERROR in cur_k during statistics!");
                break;
            }
            total_not_unified_nodes += node.second.sequence_len - cur_k;
            total_letters += node.second.sequence_len;
        }
        long total_not_unified_edges = total_edges + total_not_unified_nodes;
        total_not_unified_edges -= Node::nodes.size();
        logger->debugl2("total_edges: %ld", total_edges);
        logger->debug("total_nodes (expanded): %ld", total_not_unified_nodes);
        logger->debugl2("total_edges (expanded): %ld", total_not_unified_edges);
        logger->debugl2("total_deadends: %ld", count_deadends());
        logger->debug("total_letters: %ld", total_letters);
    }
}